

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_allocator_capture::~xpath_allocator_capture
          (xpath_allocator_capture *this)

{
  xpath_allocator_capture *this_local;
  
  xpath_allocator::revert(this->_target,&this->_state);
  return;
}

Assistant:

~xpath_allocator_capture()
		{
			_target->revert(_state);
		}